

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateImplementation.cpp
# Opt level: O0

JavascriptString * __thiscall
Js::DateImplementation::GetISOString(DateImplementation *this,ScriptContext *requestContext)

{
  bool bVar1;
  JavascriptLibrary *library;
  CompoundString *pCVar2;
  DateData local_27;
  DateData local_26;
  DateData local_25;
  DateData local_24;
  DateData local_23;
  DateData local_22;
  DateData local_21;
  CompoundString *local_20;
  CompoundString *bs;
  ScriptContext *requestContext_local;
  DateImplementation *this_local;
  
  bs = (CompoundString *)requestContext;
  requestContext_local = (ScriptContext *)this;
  bVar1 = NumberUtilities::IsFinite(this->m_tvUtc);
  if (!bVar1) {
    JavascriptError::ThrowRangeError((ScriptContext *)bs,-0x7ff5ec77,(PCWSTR)0x0);
  }
  library = ScriptContext::GetLibrary((ScriptContext *)bs);
  pCVar2 = CompoundString::NewWithCharCapacity(0x1e,library);
  local_20 = pCVar2;
  DateData::DateData(&local_21,FullYear);
  GetDateComponent(this,pCVar2,local_21,0,(ScriptContext *)bs);
  CompoundString::AppendChars(local_20,L'-');
  pCVar2 = local_20;
  DateData::DateData(&local_22,Month);
  GetDateComponent(this,pCVar2,local_22,1,(ScriptContext *)bs);
  CompoundString::AppendChars(local_20,L'-');
  pCVar2 = local_20;
  DateData::DateData(&local_23,Date);
  GetDateComponent(this,pCVar2,local_23,0,(ScriptContext *)bs);
  CompoundString::AppendChars(local_20,L'T');
  pCVar2 = local_20;
  DateData::DateData(&local_24,Hours);
  GetDateComponent(this,pCVar2,local_24,0,(ScriptContext *)bs);
  CompoundString::AppendChars(local_20,L':');
  pCVar2 = local_20;
  DateData::DateData(&local_25,Minutes);
  GetDateComponent(this,pCVar2,local_25,0,(ScriptContext *)bs);
  CompoundString::AppendChars(local_20,L':');
  pCVar2 = local_20;
  DateData::DateData(&local_26,Seconds);
  GetDateComponent(this,pCVar2,local_26,0,(ScriptContext *)bs);
  CompoundString::AppendChars(local_20,L'.');
  pCVar2 = local_20;
  DateData::DateData(&local_27,Milliseconds);
  GetDateComponent(this,pCVar2,local_27,0,(ScriptContext *)bs);
  CompoundString::AppendChars(local_20,L'Z');
  return (JavascriptString *)local_20;
}

Assistant:

JavascriptString*
    DateImplementation::GetISOString(ScriptContext* requestContext)
    {
        // ES5 15.9.5.43: throw RangeError if time value is not a finite number
        if (!Js::NumberUtilities::IsFinite(m_tvUtc))
        {
            JavascriptError::ThrowRangeError(requestContext, JSERR_NeedNumber);
        }

        CompoundString *const bs = CompoundString::NewWithCharCapacity(30, requestContext->GetLibrary());

        GetDateComponent(bs, DateData::FullYear, 0, requestContext);
        bs->AppendChars(_u('-'));
        // month
        GetDateComponent(bs, DateData::Month, 1/*adjustment*/, requestContext);
        bs->AppendChars(_u('-'));
        // date
        GetDateComponent(bs, DateData::Date, 0, requestContext);
        bs->AppendChars(_u('T'));
        // hours
        GetDateComponent(bs, DateData::Hours, 0, requestContext);
        bs->AppendChars(_u(':'));
        // minutes
        GetDateComponent(bs, DateData::Minutes, 0, requestContext);
        bs->AppendChars(_u(':'));
        // seconds
        GetDateComponent(bs, DateData::Seconds, 0, requestContext);

        // ES5 fill in milliseconds but v5.8 does not
        bs->AppendChars(_u('.'));
        // milliseconds
        GetDateComponent(bs, DateData::Milliseconds, 0, requestContext);

        bs->AppendChars(_u('Z'));

        return bs;
    }